

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O3

wchar_t archive_read_disk_descend(archive *_a)

{
  int *piVar1;
  tree *t;
  tree_entry *ptVar2;
  int iVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  uint uVar6;
  
  t = *(tree **)&_a[1].archive_format;
  iVar3 = __archive_check_magic(_a,0xbadb0c5,6,"archive_read_disk_descend");
  wVar5 = L'\xffffffe2';
  if (iVar3 != -0x1e) {
    wVar4 = archive_read_disk_can_descend(_a);
    wVar5 = L'\0';
    if (wVar4 != L'\0') {
      wVar5 = tree_current_is_physical_dir(t);
      if (wVar5 == L'\0') {
        wVar5 = tree_current_is_dir(t);
        if (wVar5 != L'\0') {
          tree_push(t,t->basename,t->current_filesystem_id,(t->st).st_dev,(t->st).st_ino,
                    &t->restore_time);
          piVar1 = &t->stack->flags;
          *piVar1 = *piVar1 | 2;
        }
      }
      else {
        tree_push(t,t->basename,t->current_filesystem_id,(t->lst).st_dev,(t->lst).st_ino,
                  &t->restore_time);
        ptVar2 = t->stack;
        if (ptVar2->parent->parent == (tree_entry *)0x0) {
          uVar6 = ptVar2->flags | 2;
        }
        else {
          uVar6 = ptVar2->flags | 1;
        }
        ptVar2->flags = uVar6;
      }
      t->descend = 0;
      wVar5 = L'\0';
    }
  }
  return wVar5;
}

Assistant:

int
archive_read_disk_descend(struct archive *_a)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	struct tree *t = a->tree;

	archive_check_magic(_a, ARCHIVE_READ_DISK_MAGIC,
	    ARCHIVE_STATE_HEADER | ARCHIVE_STATE_DATA,
	    "archive_read_disk_descend");

	if (!archive_read_disk_can_descend(_a))
		return (ARCHIVE_OK);

	/*
	 * We must not treat the initial specified path as a physical dir,
	 * because if we do then we will try and ascend out of it by opening
	 * ".." which is (a) wrong and (b) causes spurious permissions errors
	 * if ".." is not readable by us. Instead, treat it as if it were a
	 * symlink. (This uses an extra fd, but it can only happen once at the
	 * top level of a traverse.) But we can't necessarily assume t->st is
	 * valid here (though t->lst is), which complicates the logic a
	 * little.
	 */
	if (tree_current_is_physical_dir(t)) {
		tree_push(t, t->basename, t->current_filesystem_id,
		    t->lst.st_dev, t->lst.st_ino, &t->restore_time);
		if (t->stack->parent->parent != NULL)
			t->stack->flags |= isDir;
		else
			t->stack->flags |= isDirLink;
	} else if (tree_current_is_dir(t)) {
		tree_push(t, t->basename, t->current_filesystem_id,
		    t->st.st_dev, t->st.st_ino, &t->restore_time);
		t->stack->flags |= isDirLink;
	}
	t->descend = 0;
	return (ARCHIVE_OK);
}